

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintBytesInObjectTo(uchar *buf,size_t size,iu_ostream *os)

{
  byte bVar1;
  char cVar2;
  ostream *poVar3;
  ulong uStack_30;
  uchar n;
  size_t i;
  size_t kMaxCount;
  iu_ostream *os_local;
  size_t size_local;
  uchar *buf_local;
  
  poVar3 = (ostream *)std::ostream::operator<<(os,size);
  std::operator<<(poVar3,"-Byte object < ");
  if ((buf != (uchar *)0x0) && (size != 0)) {
    for (uStack_30 = 0; uStack_30 < size; uStack_30 = uStack_30 + 1) {
      if (uStack_30 == 0x20) {
        std::operator<<(os,"... ");
        break;
      }
      bVar1 = buf[uStack_30];
      cVar2 = ToHex((int)(uint)bVar1 >> 4);
      poVar3 = std::operator<<(os,cVar2);
      cVar2 = ToHex(bVar1 & 0xf);
      poVar3 = std::operator<<(poVar3,cVar2);
      std::operator<<(poVar3," ");
    }
  }
  std::operator<<(os,">");
  return;
}

Assistant:

inline void PrintBytesInObjectTo(const unsigned char* buf, size_t size, iu_ostream* os)
{
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
    const size_t kMaxCount = detail::kValues::MaxPrintContainerCount;
    *os << size << "-Byte object < ";
    if( buf != IUTEST_NULLPTR && size > 0 )
    {
        for( size_t i=0; i < size; ++i )
        {
            if( i == kMaxCount )
            {
                *os << "... ";
                break;
            }
#ifdef __clang_analyzer__
            const unsigned char n = 0;  // suppress
#else
            const unsigned char n = buf[i];
#endif
            *os << ToHex((n>>4)&0xF) << ToHex(n&0xF) << " ";
        }
    }
    *os << ">";
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
}